

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

shared_ptr<cppcms::impl::cgi::http> __thiscall cppcms::impl::cgi::http::self(http *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cppcms::impl::cgi::http> sVar1;
  enable_shared_from_this<cppcms::impl::cgi::connection> *in_stack_ffffffffffffffc8;
  
  std::enable_shared_from_this<cppcms::impl::cgi::connection>::shared_from_this
            (in_stack_ffffffffffffffc8);
  std::static_pointer_cast<cppcms::impl::cgi::http,cppcms::impl::cgi::connection>
            ((shared_ptr<cppcms::impl::cgi::connection> *)in_RDI);
  std::shared_ptr<cppcms::impl::cgi::connection>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection> *)0x49b4b7);
  sVar1.super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppcms::impl::cgi::http>)
         sVar1.super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<http> self()
		{
			return booster::static_pointer_cast<http>(shared_from_this());
		}